

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_query_result.cpp
# Opt level: O3

unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> __thiscall
duckdb::StreamQueryResult::FetchInternal(StreamQueryResult *this,ClientContextLock *lock)

{
  _Head_base<0UL,_duckdb::DataChunk_*,_false> _Var1;
  __uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> _Var2;
  StreamExecutionResult SVar3;
  BufferedData *pBVar4;
  pointer pDVar5;
  ClientContext *this_00;
  ClientContextLock *in_RDX;
  ErrorData error;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_1d8 [5];
  __uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> local_1b0 [48];
  
  local_1d8[0]._M_head_impl = (DataChunk *)0x0;
  pBVar4 = shared_ptr<duckdb::BufferedData,_true>::operator->
                     ((shared_ptr<duckdb::BufferedData,_true> *)(lock + 0x33));
  SVar3 = BufferedData::ReplenishBuffer(pBVar4,(StreamQueryResult *)lock,in_RDX);
  if ((SVar3 & ~CHUNK_NOT_READY) != EXECUTION_ERROR) {
    pBVar4 = shared_ptr<duckdb::BufferedData,_true>::operator->
                       ((shared_ptr<duckdb::BufferedData,_true> *)(lock + 0x33));
    (*pBVar4->_vptr_BufferedData[3])(local_1b0,pBVar4);
    _Var2._M_t.super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
    super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl =
         local_1b0[0]._M_t.
         super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
         super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl;
    _Var1._M_head_impl = local_1d8[0]._M_head_impl;
    local_1b0[0]._M_t.
    super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
    super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl =
         (tuple<duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>)
         (_Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>)0x0;
    local_1d8[0]._M_head_impl =
         (DataChunk *)
         _Var2._M_t.
         super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
         super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl;
    if (_Var1._M_head_impl != (DataChunk *)0x0) {
      DataChunk::~DataChunk(_Var1._M_head_impl);
      operator_delete(_Var1._M_head_impl);
      _Var2._M_t.
      super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
      super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl =
           local_1b0[0]._M_t.
           super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
           super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl;
      if (local_1b0[0]._M_t.
          super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
          super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>)0x0) {
        DataChunk::~DataChunk
                  ((DataChunk *)
                   local_1b0[0]._M_t.
                   super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>
                   .super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl);
        operator_delete((void *)_Var2._M_t.
                                super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>
                                .super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl);
      }
    }
    if (((local_1d8[0]._M_head_impl == (DataChunk *)0x0) ||
        (pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                  operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                              *)local_1d8),
        (pDVar5->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (pDVar5->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start)) ||
       (pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)local_1d8), pDVar5->count == 0)) {
      this_00 = shared_ptr<duckdb::ClientContext,_true>::operator->
                          ((shared_ptr<duckdb::ClientContext,_true> *)(lock + 0x31));
      ClientContext::CleanupInternal(this_00,in_RDX,(BaseQueryResult *)lock,false);
      _Var1._M_head_impl = local_1d8[0]._M_head_impl;
      local_1d8[0]._M_head_impl = (DataChunk *)0x0;
      if (_Var1._M_head_impl != (DataChunk *)0x0) {
        DataChunk::~DataChunk(_Var1._M_head_impl);
        operator_delete(_Var1._M_head_impl);
      }
    }
  }
  (this->super_QueryResult).super_BaseQueryResult._vptr_BaseQueryResult =
       (_func_int **)local_1d8[0]._M_head_impl;
  return (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
         (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)this;
}

Assistant:

unique_ptr<DataChunk> StreamQueryResult::FetchInternal(ClientContextLock &lock) {
	bool invalidate_query = true;
	unique_ptr<DataChunk> chunk;
	try {
		// fetch the chunk and return it
		auto stream_execution_result = buffered_data->ReplenishBuffer(*this, lock);
		if (ExecutionErrorOccurred(stream_execution_result)) {
			return chunk;
		}
		chunk = buffered_data->Scan();
		if (!chunk || chunk->ColumnCount() == 0 || chunk->size() == 0) {
			context->CleanupInternal(lock, this);
			chunk = nullptr;
		}
		return chunk;
	} catch (std::exception &ex) {
		ErrorData error(ex);
		if (!Exception::InvalidatesTransaction(error.Type())) {
			// standard exceptions do not invalidate the current transaction
			invalidate_query = false;
		} else if (Exception::InvalidatesDatabase(error.Type())) {
			// fatal exceptions invalidate the entire database
			auto &config = context->config;
			if (!config.query_verification_enabled) {
				auto &db_instance = DatabaseInstance::GetDatabase(*context);
				ValidChecker::Invalidate(db_instance, error.RawMessage());
			}
		}
		context->ProcessError(error, context->GetCurrentQuery());
		SetError(std::move(error));
	} catch (...) { // LCOV_EXCL_START
		SetError(ErrorData("Unhandled exception in FetchInternal"));
	} // LCOV_EXCL_STOP
	context->CleanupInternal(lock, this, invalidate_query);
	return nullptr;
}